

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O2

ON_wString __thiscall
ON_wString::EncodeXMLValue(ON_wString *this,bool bEncodeCodePointsAboveBasicLatin)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  ON_Internal_Empty_wString *pOVar4;
  wchar_t *pwVar5;
  ulong uVar6;
  wchar_t *pwVar7;
  long lVar8;
  uint in_EDX;
  size_t hex_buffer_capacity;
  size_t hex_buffer_capacity_00;
  uint uVar9;
  wchar_t *pwVar10;
  wchar_t wVar11;
  undefined7 in_register_00000031;
  uint uVar12;
  uint uVar13;
  wchar_t *buffer1;
  ON_wString *pOVar14;
  bool bVar15;
  ON_wString s;
  ON__UINT32 u_1;
  ON_UnicodeErrorParameters e;
  uint hex_digits [8];
  ON_wString local_90;
  ON__UINT32 local_84;
  ON_wString *local_80;
  ON_UnicodeErrorParameters local_78;
  uint local_6c;
  ON_wString *local_68;
  long local_60;
  uint local_58 [10];
  
  pwVar7 = ((ON_wString *)CONCAT71(in_register_00000031,bEncodeCodePointsAboveBasicLatin))->m_s;
  pOVar4 = &empty_wstring;
  if (pwVar7 != (wchar_t *)0x0) {
    pOVar4 = (ON_Internal_Empty_wString *)(pwVar7 + -3);
  }
  lVar8 = (long)(pOVar4->header).string_length;
  if (((lVar8 < 1) || (pwVar7 == (wchar_t *)0x0)) || ((pOVar4->header).string_capacity < 1)) {
    pOVar14 = &EmptyString;
  }
  else {
    local_58[4] = 0;
    local_58[5] = 0;
    local_58[6] = 0;
    local_58[7] = 0;
    local_58[0] = 0;
    local_58[1] = 0;
    local_58[2] = 0;
    local_58[3] = 0;
    pwVar10 = pwVar7 + lVar8;
    uVar9 = 0;
    uVar12 = in_EDX ^ 1;
    local_80 = this;
    local_68 = (ON_wString *)CONCAT71(in_register_00000031,bEncodeCodePointsAboveBasicLatin);
    local_60 = lVar8;
    for (pwVar5 = pwVar7; pwVar5 < pwVar10; pwVar5 = pwVar5 + 1) {
      wVar11 = *pwVar5;
      if (wVar11 == L'>') {
LAB_0066fa5c:
        uVar13 = uVar9 + 3;
      }
      else if (wVar11 == L'&') {
        uVar13 = uVar9 + 4;
      }
      else {
        if (wVar11 != L'\'') {
          if (wVar11 == L'<') goto LAB_0066fa5c;
          if (wVar11 != L'\"') {
            uVar13 = uVar9;
            if (0x7f < (uint)wVar11 && (char)uVar12 == '\0') {
              local_78.m_error_code_point = ON_UnicodeErrorParameters::MaskErrors.m_error_code_point
              ;
              local_78.m_error_status = ON_UnicodeErrorParameters::MaskErrors.m_error_status;
              local_78.m_error_mask = ON_UnicodeErrorParameters::MaskErrors.m_error_mask;
              local_90.m_s._0_4_ = 0xfffd;
              iVar1 = ON_DecodeWideChar(pwVar5,(int)((ulong)((long)pwVar10 - (long)pwVar5) >> 2),
                                        &local_78,(ON__UINT32 *)&local_90);
              if ((0 < iVar1) &&
                 (iVar2 = ON_IsValidUnicodeCodePoint((ON__UINT32)local_90.m_s), iVar2 != 0)) {
                uVar3 = Internal_ToHexDigits((ON__UINT32)local_90.m_s,local_58,hex_buffer_capacity);
                uVar13 = iVar1 - 1;
                if (uVar3 == 0) {
                  uVar13 = 0;
                }
                pwVar5 = pwVar5 + uVar13;
                uVar13 = uVar9 + 3 + uVar3;
                if (uVar3 == 0) {
                  uVar13 = uVar9;
                }
              }
            }
            goto LAB_0066faf1;
          }
        }
        uVar13 = uVar9 + 5;
      }
LAB_0066faf1:
      uVar9 = uVar13 + 1;
    }
    pOVar14 = local_68;
    this = local_80;
    if ((int)local_60 < (int)uVar9) {
      ON_wString(&local_90);
      pwVar5 = ReserveArray(&local_90,(ulong)uVar9);
      uVar13 = uVar12;
      if (pwVar5 == (wchar_t *)0x0) {
        ON_wString(local_80,&EmptyString);
      }
      else {
        for (; local_6c = uVar13, pwVar7 < pwVar10; pwVar7 = pwVar7 + 1) {
          wVar11 = *pwVar7;
          *pwVar5 = wVar11;
          if (wVar11 == L'>') {
            builtin_wcsncpy(pwVar5,L"&gt;",4);
LAB_0066fcd2:
            pwVar5 = pwVar5 + 4;
          }
          else if (wVar11 == L'&') {
            builtin_wcsncpy(pwVar5,L"&amp;",5);
            pwVar5 = pwVar5 + 5;
          }
          else {
            if (wVar11 == L'\'') {
              builtin_wcsncpy(pwVar5,L"&apos;",6);
            }
            else {
              if (wVar11 == L'<') {
                builtin_wcsncpy(pwVar5,L"&lt;",4);
                goto LAB_0066fcd2;
              }
              if (wVar11 != L'\"') {
                if (0x7f < (uint)wVar11 && (char)uVar12 == '\0') {
                  local_78.m_error_code_point =
                       ON_UnicodeErrorParameters::MaskErrors.m_error_code_point;
                  local_78.m_error_status = ON_UnicodeErrorParameters::MaskErrors.m_error_status;
                  local_78.m_error_mask = ON_UnicodeErrorParameters::MaskErrors.m_error_mask;
                  local_84 = 0xfffd;
                  iVar1 = ON_DecodeWideChar(pwVar7,(int)((ulong)((long)pwVar10 - (long)pwVar7) >> 2)
                                            ,&local_78,&local_84);
                  uVar12 = local_6c;
                  if (((0 < iVar1) &&
                      (iVar2 = ON_IsValidUnicodeCodePoint(local_84), uVar12 = local_6c, iVar2 != 0))
                     && (uVar13 = Internal_ToHexDigits(local_84,local_58,hex_buffer_capacity_00),
                        uVar12 = local_6c, uVar13 != 0)) {
                    pwVar5[0] = L'&';
                    pwVar5[1] = L'#';
                    pwVar5[2] = L'x';
                    pwVar5 = pwVar5 + 3;
                    uVar6 = (ulong)uVar13;
                    while (bVar15 = uVar6 != 0, uVar6 = uVar6 - 1, bVar15) {
                      uVar13 = local_58[uVar6];
                      wVar11 = uVar13 | 0x30;
                      if (9 < uVar13) {
                        wVar11 = uVar13 + L'W';
                      }
                      *pwVar5 = wVar11;
                      pwVar5 = pwVar5 + 1;
                    }
                    *pwVar5 = L';';
                    pwVar7 = pwVar7 + (iVar1 - 1);
                  }
                }
                pwVar5 = pwVar5 + 1;
                goto LAB_0066fd1f;
              }
              builtin_wcsncpy(pwVar5,L"&quot;",6);
            }
            pwVar5 = pwVar5 + 6;
          }
LAB_0066fd1f:
          uVar13 = local_6c;
        }
        *pwVar5 = L'\0';
        pOVar14 = &local_90;
        pwVar7 = Array(pOVar14);
        uVar6 = (ulong)((long)pwVar5 - (long)pwVar7) >> 2;
        if (uVar9 == (uint)uVar6) {
          SetLength(pOVar14,uVar6 & 0xffffffff);
        }
        else {
          pOVar14 = &EmptyString;
        }
        ON_wString(local_80,pOVar14);
      }
      ~ON_wString(&local_90);
      return (ON_wString)(wchar_t *)local_80;
    }
  }
  ON_wString(this,pOVar14);
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_wString::EncodeXMLValue(
  bool bEncodeCodePointsAboveBasicLatin
) const
{
  const int length0 = this->Length();
  if (length0 <= 0)
    return ON_wString::EmptyString;

  const wchar_t* buffer0 = this->Array();
  if (nullptr == buffer0)
    return ON_wString::EmptyString;
  unsigned hex_digits[8] = {};
  const unsigned hex_digit_capacity = (unsigned)(sizeof(hex_digits) / sizeof(hex_digits[0]));

  const wchar_t* buffer0_end = buffer0 + length0;
  int length1 = 0;
  struct ON_UnicodeErrorParameters e;
  for (const wchar_t* buffer1 = buffer0; buffer1 < buffer0_end; ++buffer1, ++length1)
  {
    const wchar_t c = *buffer1;
    switch (c)
    {
    case ON_UnicodeCodePoint::ON_QuotationMark:
      length1 += 5;
      break;
    case ON_UnicodeCodePoint::ON_Ampersand:
      length1 += 4;
      break;
    case ON_UnicodeCodePoint::ON_Apostrophe:
      length1 += 5;
      break;
    case ON_UnicodeCodePoint::ON_LessThanSign:
      length1 += 3;
      break;
    case ON_UnicodeCodePoint::ON_GreaterThanSign:
      length1 += 3;
      break;
    default:
      if (bEncodeCodePointsAboveBasicLatin && (c < 0 || c > 127))
      {
        e = ON_UnicodeErrorParameters::MaskErrors;
        ON__UINT32 u = ON_UnicodeCodePoint::ON_ReplacementCharacter;
        const int decoded_wchar_count = ON_DecodeWideChar(buffer1, (int)(buffer0_end - buffer1), &e, &u);
        if (decoded_wchar_count > 0 && ON_IsValidUnicodeCodePoint(u))
        {
          const unsigned hex_digit_count = Internal_ToHexDigits(u, hex_digits, hex_digit_capacity);
          if (hex_digit_count > 0)
          {
            length1 += hex_digit_count;
            length1 += 3;
            buffer1 += (decoded_wchar_count-1);
          }
        }
      }
    break;
    }
  }

  if (length1 <= length0)
    return *this; // nothing to encode

  ON_wString s;
  wchar_t* encoded = s.ReserveArray(length1);
  if (nullptr == encoded)
    return ON_wString::EmptyString; // catastrophe

  for (const wchar_t* buffer1 = buffer0; buffer1 < buffer0_end; ++buffer1)
  {
    *encoded = *buffer1;
    switch (*encoded)
    {
    case ON_UnicodeCodePoint::ON_QuotationMark:
      *encoded++ = ON_wString::Ampersand;
      *encoded++ = 'q';
      *encoded++ = 'u';
      *encoded++ = 'o';
      *encoded++ = 't';
      *encoded++ = ON_wString::Semicolon;
      break;

    case ON_UnicodeCodePoint::ON_Ampersand:
      *encoded++ = ON_wString::Ampersand;
      *encoded++ = 'a';
      *encoded++ = 'm';
      *encoded++ = 'p';
      *encoded++ = ON_wString::Semicolon;
      break;

    case ON_UnicodeCodePoint::ON_Apostrophe:
      *encoded++ = ON_wString::Ampersand;
      *encoded++ = 'a';
      *encoded++ = 'p';
      *encoded++ = 'o';
      *encoded++ = 's';
      *encoded++ = ON_wString::Semicolon;
      break;

    case ON_UnicodeCodePoint::ON_LessThanSign:
      *encoded++ = ON_wString::Ampersand;
      *encoded++ = 'l';
      *encoded++ = 't';
      *encoded++ = ON_wString::Semicolon;
      break;

    case ON_UnicodeCodePoint::ON_GreaterThanSign:
      *encoded++ = ON_wString::Ampersand;
      *encoded++ = 'g';
      *encoded++ = 't';
      *encoded++ = ON_wString::Semicolon;
      break;

    default:
      if (bEncodeCodePointsAboveBasicLatin && (*encoded < 0 || *encoded > 127))
      {
        e = ON_UnicodeErrorParameters::MaskErrors;
        ON__UINT32 u = ON_UnicodeCodePoint::ON_ReplacementCharacter;
        const int decoded_wchar_count = ON_DecodeWideChar(buffer1, (int)(buffer0_end - buffer1), &e, &u);
        if (decoded_wchar_count > 0 && ON_IsValidUnicodeCodePoint(u))
        {
          unsigned hex_digit_count = Internal_ToHexDigits(u, hex_digits, hex_digit_capacity);
          if (hex_digit_count > 0)
          {
            *encoded++ = ON_wString::Ampersand;
            *encoded++ = ON_wString::NumberSign;
            *encoded++ = 'x';
            while(hex_digit_count>0)
            {
              --hex_digit_count;
              const unsigned h = hex_digits[hex_digit_count];
              if (h <= 9)
                *encoded++ = (wchar_t)('0' + h);
              else
                *encoded++ = (wchar_t)('a' + (h - 10));
            }
            *encoded = ON_wString::Semicolon;
            buffer1 += (decoded_wchar_count - 1);
          }
        }
      }
      ++encoded;
    }
  }
  *encoded = 0;
  const int encoded_length = (int)(encoded - s.Array());
  if (encoded_length == length1)
  {
    s.SetLength(encoded_length);
    return s;
  }

  return ON_wString::EmptyString; // catastrophe!
}